

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O1

bool __thiscall QHttp2Connection::readClientPreface(QHttp2Connection *this)

{
  char *pcVar1;
  long lVar2;
  long in_FS_OFFSET;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (char *)QMetaObject::cast((QObject *)&QIODevice::staticMetaObject);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  lVar2 = QIODevice::read(pcVar1,(longlong)&local_28);
  if (lVar2 == 0x18) {
    auVar5[0] = -((char)local_18 == '\r');
    auVar5[1] = -((char)((ulong)local_18 >> 8) == '\n');
    auVar5[2] = -((char)((ulong)local_18 >> 0x10) == 'S');
    auVar5[3] = -((char)((ulong)local_18 >> 0x18) == 'M');
    auVar5[4] = -((char)((ulong)local_18 >> 0x20) == '\r');
    auVar5[5] = -((char)((ulong)local_18 >> 0x28) == '\n');
    auVar5[6] = -((char)((ulong)local_18 >> 0x30) == '\r');
    auVar5[7] = -((char)((ulong)local_18 >> 0x38) == '\n');
    auVar5[8] = 0xff;
    auVar5[9] = 0xff;
    auVar5[10] = 0xff;
    auVar5[0xb] = 0xff;
    auVar5[0xc] = 0xff;
    auVar5[0xd] = 0xff;
    auVar5[0xe] = 0xff;
    auVar5[0xf] = 0xff;
    auVar4[0] = -((char)local_28 == 'P');
    auVar4[1] = -(local_28._1_1_ == 'R');
    auVar4[2] = -(local_28._2_1_ == 'I');
    auVar4[3] = -(local_28._3_1_ == ' ');
    auVar4[4] = -(local_28._4_1_ == '*');
    auVar4[5] = -(local_28._5_1_ == ' ');
    auVar4[6] = -(local_28._6_1_ == 'H');
    auVar4[7] = -(local_28._7_1_ == 'T');
    auVar4[8] = -((char)uStack_20 == 'T');
    auVar4[9] = -(uStack_20._1_1_ == 'P');
    auVar4[10] = -(uStack_20._2_1_ == '/');
    auVar4[0xb] = -(uStack_20._3_1_ == '2');
    auVar4[0xc] = -(uStack_20._4_1_ == '.');
    auVar4[0xd] = -(uStack_20._5_1_ == '0');
    auVar4[0xe] = -(uStack_20._6_1_ == '\r');
    auVar4[0xf] = -(uStack_20._7_1_ == '\n');
    auVar4 = auVar4 & auVar5;
    bVar3 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff;
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::readClientPreface()
{
    auto *socket = getSocket();
    Q_ASSERT(socket->bytesAvailable() >= Http2::clientPrefaceLength);
    char buffer[Http2::clientPrefaceLength];
    const qint64 read = socket->read(buffer, Http2::clientPrefaceLength);
    if (read != Http2::clientPrefaceLength)
        return false;
    return memcmp(buffer, Http2::Http2clientPreface, Http2::clientPrefaceLength) == 0;
}